

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1b_grandfather.cpp
# Opt level: O3

int main(void)

{
  istream *this;
  bool bVar1;
  int m;
  int n;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  d;
  int local_48;
  int local_44;
  _Hashtable<long_long,_std::pair<const_long_long,_long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_40;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105180) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_44);
  std::istream::operator>>(this,&local_48);
  local_40._M_buckets = &local_40._M_single_bucket;
  local_40._M_bucket_count = 1;
  local_40._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_40._M_element_count = 0;
  local_40._M_rehash_policy._M_max_load_factor = 1.0;
  local_40._M_rehash_policy._M_next_resize = 0;
  local_40._M_single_bucket = (__node_base_ptr)0x0;
  while( true ) {
    bVar1 = local_44 == 0;
    local_44 = local_44 + -1;
    if (bVar1) break;
    get_father_son((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                    *)&local_40);
  }
  while (bVar1 = local_48 != 0, local_48 = local_48 + -1, bVar1) {
    solve((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
           *)&local_40);
  }
  std::
  _Hashtable<long_long,_std::pair<const_long_long,_long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_40);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int n, m;
    cin >> n >> m;
    unordered_map<long long, long long> d;
    while (n--)
        get_father_son(d);
    while (m--)
        solve(d);
}